

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_0::AsyncStreamFd::pumpFromFile
          (AsyncStreamFd *this,FileInputStream *input,int fileFd,uint64_t amount,uint64_t soFar)

{
  PromiseArena *pPVar1;
  AsyncStreamFd *pAVar2;
  int iVar3;
  ssize_t sVar4;
  OwnPromiseNode OVar5;
  void *pvVar6;
  PromiseNode *extraout_RAX;
  OwnPromiseNode extraout_RAX_00;
  undefined4 in_register_00000014;
  TransformPromiseNodeBase *this_00;
  int __in_fd;
  PromiseArena *in_R9;
  size_t __count;
  Fault f;
  off_t offset;
  OwnPromiseNode local_80;
  AsyncStreamFd *local_78;
  AsyncInputStream *local_70;
  PromiseArena *local_68;
  AsyncInputStream local_60;
  AsyncInputStream local_58;
  OwnPromiseNode local_50;
  undefined1 local_48 [24];
  
  if (in_R9 < soFar) {
    local_58._vptr_AsyncInputStream =
         ((AsyncInputStream *)CONCAT44(in_register_00000014,fileFd))[2]._vptr_AsyncInputStream;
    local_78 = this;
    local_70 = (AsyncInputStream *)CONCAT44(in_register_00000014,fileFd);
    local_68 = (PromiseArena *)soFar;
    do {
      __count = (long)local_68 - (long)in_R9;
      if (0xfffffffe < __count) {
        __count = 0xffffffff;
      }
      do {
        __in_fd = (int)amount;
        sVar4 = sendfile64((int)input->offset,__in_fd,(__off64_t *)&local_58,__count);
        if (-1 < sVar4) {
          this = local_78;
          if (sVar4 != 0) goto LAB_00491ac7;
          goto LAB_00491c93;
        }
        iVar3 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar3 == -1);
      if (0x15 < iVar3) {
        if ((iVar3 == 0x26) || (iVar3 == 0x16)) {
          OVar5.ptr = (PromiseNode *)
                      unoptimizedPumpTo((kj *)local_78,local_70,(AsyncOutputStream *)&input->file,
                                        (uint64_t)local_68,(uint64_t)in_R9);
          return (Promise<unsigned_long>)OVar5.ptr;
        }
LAB_00491cbd:
        local_60._vptr_AsyncInputStream = (_func_int **)0x0;
        local_48._0_8_ = (PromiseFulfiller<void> *)0x0;
        local_48._8_8_ = (Disposer *)0x0;
        kj::_::Debug::Fault::init
                  ((Fault *)&local_60,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                  );
        kj::_::Debug::Fault::fatal((Fault *)&local_60);
      }
      if (iVar3 != 0) {
        if (iVar3 == 0xb) {
          UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)&local_80);
          OVar5.ptr = local_80.ptr;
          pPVar1 = (PromiseArena *)
                   ((SleepHooks *)&((local_80.ptr)->super_PromiseArenaMember).arena)->
                   _vptr_SleepHooks;
          if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_80.ptr - (long)pPVar1) < 0x48) {
            pvVar6 = operator_new(0x400);
            this_00 = (TransformPromiseNodeBase *)((long)pvVar6 + 0x3b8);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      (this_00,&local_80,
                       kj::_::
                       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:285:21)>
                       ::anon_class_40_5_87a5c74d_for_func::operator());
            *(undefined ***)((long)pvVar6 + 0x3b8) = &PTR_destroy_006e22a8;
            *(FileInputStream **)((long)pvVar6 + 0x3d8) = input;
            *(AsyncInputStream **)((long)pvVar6 + 0x3e0) = local_70;
            *(int *)((long)pvVar6 + 1000) = __in_fd;
            *(PromiseArena **)((long)pvVar6 + 0x3f0) = local_68;
            *(PromiseArena **)((long)pvVar6 + 0x3f8) = in_R9;
            *(void **)((long)pvVar6 + 0x3c0) = pvVar6;
          }
          else {
            ((SleepHooks *)&((local_80.ptr)->super_PromiseArenaMember).arena)->_vptr_SleepHooks =
                 (_func_int **)0x0;
            this_00 = (TransformPromiseNodeBase *)&local_80.ptr[-5].super_PromiseArenaMember.arena;
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      (this_00,&local_80,
                       kj::_::
                       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:285:21)>
                       ::anon_class_40_5_87a5c74d_for_func::operator());
            OVar5.ptr[-5].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_006e22a8;
            OVar5.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)input;
            OVar5.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)local_70
            ;
            *(int *)&OVar5.ptr[-2].super_PromiseArenaMember.arena = __in_fd;
            OVar5.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)local_68
            ;
            OVar5.ptr[-1].super_PromiseArenaMember.arena = in_R9;
            OVar5.ptr[-4].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
          }
          pAVar2 = local_78;
          local_48._0_8_ = &DAT_004ddfe0;
          local_48._8_8_ = &DAT_004de03f;
          local_48._16_8_ = (PromiseFulfiller<void> *)0x4c0000058b;
          local_50.ptr = &this_00->super_PromiseNode;
          kj::_::PromiseDisposer::
          appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                    ((PromiseDisposer *)&local_60,&local_50,(SourceLocation *)local_48);
          OVar5.ptr = local_50.ptr;
          (pAVar2->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
          _vptr_AsyncInputStream = local_60._vptr_AsyncInputStream;
          if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
            local_50.ptr = (PromiseNode *)0x0;
            kj::_::PromiseDisposer::dispose(&(OVar5.ptr)->super_PromiseArenaMember);
            local_60._vptr_AsyncInputStream = (_func_int **)extraout_RAX;
          }
          OVar5.ptr = local_80.ptr;
          if ((UnixEventPort *)local_80.ptr == (UnixEventPort *)0x0) {
            return (Promise<unsigned_long>)local_60._vptr_AsyncInputStream;
          }
          local_80.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(&(OVar5.ptr)->super_PromiseArenaMember);
          return (Promise<unsigned_long>)extraout_RAX_00.ptr;
        }
        goto LAB_00491cbd;
      }
LAB_00491ac7:
      local_70[2]._vptr_AsyncInputStream = local_58._vptr_AsyncInputStream;
      in_R9 = (PromiseArena *)((long)in_R9->bytes + sVar4);
      this = local_78;
    } while (in_R9 < local_68);
  }
LAB_00491c93:
  local_48._0_8_ = in_R9;
  kj::_::PromiseDisposer::
  alloc<kj::_::ImmediatePromiseNode<unsigned_long>,kj::_::PromiseDisposer,unsigned_long>
            ((PromiseDisposer *)&local_60,(unsigned_long *)local_48);
  (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = local_60._vptr_AsyncInputStream;
  return (Promise<unsigned_long>)(OwnPromiseNode)local_60._vptr_AsyncInputStream;
}

Assistant:

Promise<uint64_t> pumpFromFile(FileInputStream& input, int fileFd,
                                 uint64_t amount, uint64_t soFar) {
    while (soFar < amount) {
      off_t offset = input.getOffset();
      ssize_t n;

      // Although sendfile()'s last argument has type size_t, on Linux it seems to cause EINVAL
      // if we pass an amount that is greater than UINT32_MAX, so make sure to clamp to that. In
      // practice, of course, we'll be limited to the socket buffer size.
      size_t requested = kj::min(amount - soFar, (uint32_t)kj::maxValue);

      KJ_SYSCALL_HANDLE_ERRORS(n = sendfile(fd, fileFd, &offset, requested)) {
        case EINVAL:
        case ENOSYS:
          // Fall back to regular pump
          return unoptimizedPumpTo(input, *this, amount, soFar);

        case EAGAIN:
          return observer.whenBecomesWritable()
              .then([this, &input, fileFd, amount, soFar]() {
            return pumpFromFile(input, fileFd, amount, soFar);
          });

        default:
          KJ_FAIL_SYSCALL("sendfile", error);
      }

      if (n == 0) break;

      input.seek(offset);  // NOTE: sendfile() updated `offset` in-place.
      soFar += n;
    }

    return soFar;
  }